

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_write(PgHdr *pPg)

{
  int iVar1;
  long in_RDI;
  int rc;
  Pager *pPager;
  PgHdr *in_stack_ffffffffffffffd8;
  int local_1c;
  Pager *pPager_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pPager_00 = *(Pager **)(in_RDI + 0x28);
  local_1c = 0;
  if ((pPager_00->eState != '\x02') || (local_1c = pager_open_journal(pPager_00), local_1c == 0)) {
    sqlite3PcacheMakeDirty((PgHdr *)0x16b1bb);
    if ((pPager_00->pInJournal != (Bitvec *)0x0) &&
       (iVar1 = sqlite3BitvecTestNotNull(pPager_00->pInJournal,*(u32 *)(in_RDI + 0x30)), iVar1 == 0)
       ) {
      if (pPager_00->dbOrigSize < *(uint *)(in_RDI + 0x30)) {
        if (pPager_00->eState != '\x04') {
          *(ushort *)(in_RDI + 0x34) = *(ushort *)(in_RDI + 0x34) | 8;
        }
      }
      else {
        local_1c = pagerAddPageToRollbackJournal
                             ((PgHdr *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                             );
        if (local_1c != 0) {
          return local_1c;
        }
      }
    }
    *(ushort *)(in_RDI + 0x34) = *(ushort *)(in_RDI + 0x34) | 4;
    if (0 < pPager_00->nSavepoint) {
      local_1c = subjournalPageIfRequired(in_stack_ffffffffffffffd8);
    }
    if (pPager_00->dbSize < *(uint *)(in_RDI + 0x30)) {
      pPager_00->dbSize = *(Pgno *)(in_RDI + 0x30);
    }
  }
  return local_1c;
}

Assistant:

static int pager_write(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;

  /* This routine is not called unless a write-transaction has already
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( pPager->errCode==0 );
  assert( pPager->readOnly==0 );
  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page.
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page that is about to be modified as dirty. */
  sqlite3PcacheMakeDirty(pPg);

  /* If a rollback journal is in use, them make sure the page that is about
  ** to change is in the rollback journal, or if the page is a new page off
  ** then end of the file, make sure it is marked as PGHDR_NEED_SYNC.
  */
  assert( (pPager->pInJournal!=0) == isOpen(pPager->jfd) );
  if( pPager->pInJournal!=0
   && sqlite3BitvecTestNotNull(pPager->pInJournal, pPg->pgno)==0
  ){
    assert( pagerUseWal(pPager)==0 );
    if( pPg->pgno<=pPager->dbOrigSize ){
      rc = pagerAddPageToRollbackJournal(pPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }else{
      if( pPager->eState!=PAGER_WRITER_DBMOD ){
        pPg->flags |= PGHDR_NEED_SYNC;
      }
      PAGERTRACE(("APPEND %d page %d needSync=%d\n",
              PAGERID(pPager), pPg->pgno,
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
    }
  }

  /* The PGHDR_DIRTY bit is set above when the page was added to the dirty-list
  ** and before writing the page into the rollback journal.  Wait until now,
  ** after the page has been successfully journalled, before setting the
  ** PGHDR_WRITEABLE bit that indicates that the page can be safely modified.
  */
  pPg->flags |= PGHDR_WRITEABLE;

  /* If the statement journal is open and the page is not in it,
  ** then write the page into the statement journal.
  */
  if( pPager->nSavepoint>0 ){
    rc = subjournalPageIfRequired(pPg);
  }

  /* Update the database size and return. */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}